

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyProtectPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  SourceRange range;
  bool bVar1;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar2;
  NameValuePragmaExpressionSyntax *pNVar3;
  Preprocessor *in_RDI;
  SourceRange SVar4;
  NameValuePragmaExpressionSyntax *nvp;
  SimplePragmaExpressionSyntax *simple;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  anon_class_16_2_cfeedcd7 handle;
  Token last;
  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *in_stack_ffffffffffffff18;
  SourceLocation in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  DiagCode in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffff40;
  SyntaxNode *in_stack_ffffffffffffff50;
  string_view local_50;
  SourceLocation local_40;
  PragmaExpressionSyntax *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Token in_stack_ffffffffffffffd8;
  
  bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                    ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x24a85d);
  if (bVar1) {
    slang::syntax::SyntaxNode::getLastToken(in_stack_ffffffffffffff50);
    local_40 = Token::location((Token *)&stack0xffffffffffffffd8);
    local_50 = Token::rawText((Token *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                             );
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_50);
    SourceLocation::operator+<unsigned_long>
              ((SourceLocation *)in_stack_ffffffffffffff28,(unsigned_long)in_RDI);
    addDiag(in_RDI,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
  }
  else {
    slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
              ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x24a943);
    slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x24a95a);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                             ((self_type *)in_RDI,in_stack_ffffffffffffff18),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                              *)0x24a988)->super_SyntaxNode;
      if (this_00->kind == SimplePragmaExpression) {
        pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(this_00)
        ;
        if (((pSVar2->value).kind == Identifier) ||
           (bVar1 = LexerFacts::isKeyword((pSVar2->value).kind), bVar1)) {
          applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                    ((anon_class_16_2_cfeedcd7 *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8);
        }
        else {
LAB_0024aa61:
          uVar5 = 0x200004;
          SVar4 = slang::syntax::SyntaxNode::sourceRange(this_00);
          range.endLoc._0_4_ = in_stack_ffffffffffffff38;
          range.startLoc = SVar4.endLoc;
          range.endLoc._4_4_ = uVar5;
          addDiag((Preprocessor *)SVar4.startLoc,SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0),
                  range);
        }
      }
      else {
        if (this_00->kind != NameValuePragmaExpression) goto LAB_0024aa61;
        pNVar3 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                           (this_00);
        in_stack_ffffffffffffff40._0_2_ = (pNVar3->name).kind;
        in_stack_ffffffffffffff40._2_1_ = (pNVar3->name).field_0x2;
        in_stack_ffffffffffffff40._3_1_ = (pNVar3->name).numFlags;
        in_stack_ffffffffffffff40._4_4_ = (pNVar3->name).rawLen;
        not_null::operator_cast_to_PragmaExpressionSyntax_
                  ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x24aa43);
        applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                  ((anon_class_16_2_cfeedcd7 *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                  *)in_RDI);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyProtectPragma(const PragmaDirectiveSyntax& pragma,
                                      SmallVectorBase<Token>& skippedTokens) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedProtectKeyword, last.location() + last.rawText().length());
        return;
    }

    auto handle = [&](Token keyword, const PragmaExpressionSyntax* args) {
        auto text = keyword.valueText();
        if (auto it = pragmaProtectHandlers.find(text); it != pragmaProtectHandlers.end())
            (this->*(it->second))(keyword, args, skippedTokens);
        else if (!text.empty())
            addDiag(diag::UnknownProtectKeyword, keyword.range()) << text;
    };

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier ||
                LexerFacts::isKeyword(simple.value.kind)) {
                handle(simple.value, nullptr);
                continue;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
            handle(nvp.name, nvp.value);
            continue;
        }

        addDiag(diag::ExpectedProtectKeyword, arg->sourceRange());
    }
}